

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QIconEngine *engine)

{
  _func_int **pp_Var1;
  char cVar2;
  long *in_RDX;
  QTextStream *pQVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QDebugStateSaver saver;
  QArrayData *local_68;
  undefined8 *local_60;
  undefined1 *local_50;
  QArrayData *local_48;
  undefined8 *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)engine);
  pQVar3 = (QTextStream *)engine->_vptr_QIconEngine;
  pQVar3[0x30] = (QTextStream)0x0;
  if (in_RDX == (long *)0x0) {
    QVar6.m_data = (storage_type *)0x14;
    QVar6.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<(pQVar3,(QString *)&local_48);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    pQVar3 = (QTextStream *)engine->_vptr_QIconEngine;
    if (pQVar3[0x30] != (QTextStream)0x1) goto LAB_0027bd77;
  }
  else {
    pQVar3[0x31] = (QTextStream)0x1;
    (**(code **)(*in_RDX + 0x38))(&local_68);
    if (local_60 == (undefined8 *)0x0) {
      local_60 = &QString::_empty;
    }
    QDebug::putString((QChar *)engine,(ulong)local_60);
    pQVar3 = (QTextStream *)engine->_vptr_QIconEngine;
    if (pQVar3[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar3,' ');
      pQVar3 = (QTextStream *)engine->_vptr_QIconEngine;
    }
    QVar4.m_data = (storage_type *)0x1;
    QVar4.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<(pQVar3,(QString *)&local_48);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    if (((QTextStream *)engine->_vptr_QIconEngine)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)engine->_vptr_QIconEngine,' ');
    }
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,0x10);
      }
    }
    QTextStream::operator<<((QTextStream *)engine->_vptr_QIconEngine,in_RDX);
    if (((QTextStream *)engine->_vptr_QIconEngine)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)engine->_vptr_QIconEngine,' ');
    }
    cVar2 = (**(code **)(*in_RDX + 0x68))();
    pQVar3 = (QTextStream *)engine->_vptr_QIconEngine;
    if (cVar2 == '\0') {
      pQVar3[0x31] = (QTextStream)0x0;
      QVar7.m_data = (storage_type *)0x2;
      QVar7.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<(pQVar3,(QString *)&local_48);
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,0x10);
        }
      }
      if (((QTextStream *)engine->_vptr_QIconEngine)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)engine->_vptr_QIconEngine,' ');
      }
      (**(code **)(*in_RDX + 0x60))(&local_48);
      if (local_40 == (undefined8 *)0x0) {
        local_40 = &QString::_empty;
      }
      QDebug::putString((QChar *)engine,(ulong)local_40);
      if (((QTextStream *)engine->_vptr_QIconEngine)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)engine->_vptr_QIconEngine,' ');
      }
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,0x10);
        }
      }
    }
    else {
      QVar5.m_data = &DAT_00000006;
      QVar5.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar5);
      QTextStream::operator<<(pQVar3,(QString *)&local_48);
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,0x10);
        }
      }
      if (((QTextStream *)engine->_vptr_QIconEngine)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)engine->_vptr_QIconEngine,' ');
      }
    }
    pQVar3 = (QTextStream *)engine->_vptr_QIconEngine;
    QVar8.m_data = (storage_type *)0x1;
    QVar8.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<(pQVar3,(QString *)&local_48);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    pQVar3 = (QTextStream *)engine->_vptr_QIconEngine;
    if (pQVar3[0x30] == (QTextStream)0x0) goto LAB_0027bd77;
  }
  QTextStream::operator<<(pQVar3,' ');
LAB_0027bd77:
  pp_Var1 = engine->_vptr_QIconEngine;
  engine->_vptr_QIconEngine = (_func_int **)0x0;
  *(_func_int ***)debug.stream = pp_Var1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)debug.stream;
}

Assistant:

QDebug operator<<(QDebug debug, QIconEngine *engine)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    if (engine) {
        debug.noquote() << engine->key() << "(";
        debug << static_cast<const void *>(engine);
        if (!engine->isNull())
            debug.quote() << ", " << engine->iconName();
        else
            debug << ", null";
        debug << ")";
    } else {
        debug << "QIconEngine(nullptr)";
    }
    return debug;
}